

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O3

ly_bool lyd_node_should_print(lyd_node *node,uint32_t options)

{
  ushort uVar1;
  uint uVar2;
  lyd_node_inner *plVar3;
  lysc_node *plVar4;
  ly_bool lVar5;
  lyd_node *plVar6;
  lyd_node_inner *plVar7;
  lyd_node *plVar8;
  
  if ((options & 0x10) == 0) {
    if ((node->flags & 1) != 0) {
      if (node->schema->nodetype == 1) {
        plVar8 = node;
        if ((options & 4) != 0) {
          return '\x01';
        }
        while( true ) {
          do {
            plVar6 = plVar8;
            if ((plVar6 != node) && (lVar5 = lyd_node_should_print(plVar6,options), lVar5 != '\0'))
            {
              return '\x01';
            }
            if ((plVar6->flags & 1) == 0) {
              __assert_fail("elem->flags & LYD_DEFAULT",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/out.c"
                            ,0x54,"ly_bool lyd_node_should_print(const struct lyd_node *, uint32_t)"
                           );
            }
          } while (((plVar6->schema == (lysc_node *)0x0) ||
                   ((plVar6->schema->nodetype & 0x711) != 0)) &&
                  (plVar8 = *(lyd_node **)(plVar6 + 1),
                  *(lyd_node **)(plVar6 + 1) != (lyd_node *)0x0));
          if (plVar6 == node) break;
          plVar8 = plVar6->next;
          if (plVar6->next == (lyd_node *)0x0) {
            plVar7 = plVar6->parent;
            do {
              plVar3 = (plVar7->field_0).node.parent;
              if (plVar3 == node->parent) {
                return '\0';
              }
              plVar8 = (plVar7->field_0).node.next;
              plVar7 = plVar3;
            } while (plVar8 == (lyd_node *)0x0);
          }
        }
      }
      else {
        if ((options & 0xe0) != 0) {
          return '\x01';
        }
        uVar1 = node->schema->flags;
        if ((uVar1 & 2) != 0) {
          return '\x01';
        }
        plVar8 = node;
        if ((uVar1 & 0x7001) == 1) {
LAB_0013a531:
          plVar6 = plVar8;
          plVar4 = plVar6->schema;
          uVar2._0_2_ = plVar4->nodetype;
          uVar2._2_2_ = plVar4->flags;
          if ((plVar4->flags & 0x80) == 0 && (undefined2)uVar2 == 1) goto LAB_0013a55d;
          if ((plVar4->flags & 2) != 0) {
            return '\x01';
          }
          if ((uVar2 & 0x711) != 0) goto LAB_0013a55d;
          goto LAB_0013a566;
        }
      }
      return '\0';
    }
  }
  else {
    if ((node->flags & 1) != 0) {
      return '\0';
    }
    plVar4 = node->schema;
    if (plVar4 != (lysc_node *)0x0) {
      if ((plVar4->nodetype & 0xc) == 0) {
        if (((plVar4->nodetype == 1) && ((plVar4->flags & 0x80) == 0)) && ((options & 4) == 0)) {
          plVar8 = *(lyd_node **)(node + 1);
          if (plVar8 == (lyd_node *)0x0) {
            return '\0';
          }
          while (lVar5 = lyd_node_should_print(plVar8,options), lVar5 == '\0') {
            plVar8 = plVar8->next;
            if (plVar8 == (lyd_node *)0x0) {
              return '\0';
            }
          }
        }
      }
      else {
        lVar5 = lyd_is_default(node);
        if (lVar5 != '\0') {
          return '\0';
        }
      }
    }
  }
  return '\x01';
LAB_0013a55d:
  plVar8 = *(lyd_node **)(plVar6 + 1);
  if (*(lyd_node **)(plVar6 + 1) == (lyd_node *)0x0) {
LAB_0013a566:
    if (plVar6 == node) {
      return '\0';
    }
    plVar8 = plVar6->next;
    if (plVar6->next == (lyd_node *)0x0) {
      plVar7 = plVar6->parent;
      do {
        plVar3 = (plVar7->field_0).node.parent;
        if (plVar3 == node->parent) {
          return '\0';
        }
        plVar8 = (plVar7->field_0).node.next;
        plVar7 = plVar3;
      } while (plVar8 == (lyd_node *)0x0);
    }
  }
  goto LAB_0013a531;
}

Assistant:

LIBYANG_API_DEF ly_bool
lyd_node_should_print(const struct lyd_node *node, uint32_t options)
{
    const struct lyd_node *elem;

    if (options & LYD_PRINT_WD_TRIM) {
        /* do not print default nodes */
        if (node->flags & LYD_DEFAULT) {
            /* implicit default node/NP container with only default nodes */
            return 0;
        } else if (node->schema && (node->schema->nodetype & LYD_NODE_TERM)) {
            if (lyd_is_default(node)) {
                /* explicit default node */
                return 0;
            }
        } else if (lysc_is_np_cont(node->schema)) {
            if (options & LYD_PRINT_KEEPEMPTYCONT) {
                /* explicit request to print, redundant to check */
                return 1;
            }

            LY_LIST_FOR(lyd_child(node), elem) {
                if (lyd_node_should_print(elem, options)) {
                    return 1;
                }
            }

            /* NP container without any printed children (such as other NP containers with only nodes set to their default values) */
            return 0;
        }
    } else if ((node->flags & LYD_DEFAULT) && (node->schema->nodetype == LYS_CONTAINER)) {
        if (options & LYD_PRINT_KEEPEMPTYCONT) {
            /* explicit request to print */
            return 1;
        }

        /* avoid empty default containers */
        LYD_TREE_DFS_BEGIN(node, elem) {
            if ((elem != node) && lyd_node_should_print(elem, options)) {
                return 1;
            }
            assert(elem->flags & LYD_DEFAULT);
            LYD_TREE_DFS_END(node, elem)
        }
        return 0;
    } else if ((node->flags & LYD_DEFAULT) && !(options & LYD_PRINT_WD_MASK) && !(node->schema->flags & LYS_CONFIG_R)) {
        /* LYD_PRINT_WD_EXPLICIT, find out if this is some input/output */
        if (!(node->schema->flags & (LYS_IS_INPUT | LYS_IS_OUTPUT | LYS_IS_NOTIF)) && (node->schema->flags & LYS_CONFIG_W)) {
            /* print only if it contains status data in its subtree */
            LYD_TREE_DFS_BEGIN(node, elem) {
                if ((elem->schema->nodetype != LYS_CONTAINER) || (elem->schema->flags & LYS_PRESENCE)) {
                    if (elem->schema->flags & LYS_CONFIG_R) {
                        return 1;
                    }
                }
                LYD_TREE_DFS_END(node, elem)
            }
        }
        return 0;
    }

    return 1;
}